

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  long lVar1;
  Curl_tree *in_RAX;
  Curl_tree *pCVar2;
  curltime older;
  curltime cVar3;
  
  if ((multi->field_0x1b1 & 0x10) == 0) {
    if (multi->timetree == (Curl_tree *)0x0) {
      pCVar2 = (Curl_tree *)0xffffffffffffffff;
      goto LAB_00684804;
    }
    cVar3 = Curl_now();
    in_RAX = Curl_splay((curltime)ZEXT816(0),multi->timetree);
    multi->timetree = in_RAX;
    lVar1 = (in_RAX->key).tv_sec;
    pCVar2 = (Curl_tree *)0x0;
    if (lVar1 < cVar3.tv_sec) goto LAB_00684804;
    if ((cVar3.tv_sec < lVar1) || (cVar3.tv_usec < (in_RAX->key).tv_usec)) {
      older._12_4_ = 0;
      older.tv_sec = SUB128(cVar3._0_12_,0);
      older.tv_usec = SUB124(cVar3._0_12_,8);
      cVar3.tv_usec = (in_RAX->key).tv_usec;
      cVar3.tv_sec = lVar1;
      cVar3._12_4_ = 0;
      in_RAX = (Curl_tree *)Curl_timediff_ceil(cVar3,older);
      pCVar2 = in_RAX;
      goto LAB_00684804;
    }
  }
  pCVar2 = (Curl_tree *)0x0;
LAB_00684804:
  *timeout_ms = (long)pCVar2;
  return (CURLMcode)in_RAX;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static const struct curltime tv_zero = {0, 0};

  if(multi->dead) {
    *timeout_ms = 0;
    return CURLM_OK;
  }

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff_ceil(multi->timetree->key, now);
      /* this should be safe even on 32 bit archs, as we don't use that
         overly long timeouts */
      *timeout_ms = (long)diff;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}